

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.cpp
# Opt level: O3

void __thiscall
LocalGraphTest_ObstacleMultiGet_Test::TestBody(LocalGraphTest_ObstacleMultiGet_Test *this)

{
  Export *pEVar1;
  ulong uVar2;
  undefined8 *puVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  undefined1 local_608 [8];
  Module wasm;
  LazyLocalGraph graph;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  char local_1f8;
  long *local_a8 [2];
  long local_98 [2];
  char local_88;
  undefined1 local_80 [8];
  Type local_78;
  AssertHelperData *local_68;
  uint local_44;
  Message local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  AssertHelper local_30;
  
  ::wasm::Module::Module((Module *)local_608);
  local_88 = '\0';
  ::wasm::WATParser::parseModule
            (&wasm.tagsMap._M_h._M_single_bucket,(Module *)local_608,0x12f,
             "\n    (module\n      (func $foo\n        ;; A set with multiple gets.\n        (local $x i32)\n        (local.set $x\n          (i32.const 10)\n        )\n        (nop)\n        (drop\n          (local.get $x)\n        )\n        (nop)\n        (drop\n          (local.get $x)\n        )\n        (nop)\n      )\n    )\n  "
             ,local_a8);
  local_80[0] = (_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 )(local_1f8 != '\x01');
  local_78.id = 0;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&wasm.tagsMap._M_h._M_single_bucket);
  if (local_88 == '\x01') {
    local_88 = '\0';
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0],local_98[0] + 1);
    }
  }
  if (local_80[0] ==
      (_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       )0x0) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&wasm.tagsMap._M_h._M_single_bucket,(internal *)local_80,
               (AssertionResult *)"WATParser::parseModule(wasm, moduleText).getErr()","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
               ,0x98,(char *)wasm.tagsMap._M_h._M_single_bucket);
    testing::internal::AssertHelper::operator=(&local_30,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wasm.tagsMap._M_h._M_single_bucket != &local_208) {
      operator_delete(wasm.tagsMap._M_h._M_single_bucket,local_208._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id)
      ;
    }
LAB_001a84f0:
    ::wasm::Module::~Module((Module *)local_608);
    return;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id);
  }
  pEVar1 = ((wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
  pcVar4 = *(char **)(pEVar1 + 0x60);
  if (*pcVar4 == '\x01') {
    uVar2 = *(ulong *)(pcVar4 + 0x28);
    if (uVar2 == 0) {
LAB_001a850c:
      __assert_fail("index < usedElements",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xbc,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    puVar3 = *(undefined8 **)(pcVar4 + 0x20);
    if (*(char *)*puVar3 == '\t') {
      if (uVar2 == 1) goto LAB_001a850c;
      if (*(char *)puVar3[1] == '\x16') {
        if (uVar2 < 4) goto LAB_001a850c;
        if (*(char *)puVar3[3] == '\x16') {
          if (uVar2 < 6) goto LAB_001a850c;
          if (*(char *)puVar3[5] == '\x16') {
            ::wasm::LazyLocalGraph::LazyLocalGraph
                      ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket,pEVar1,local_608,0x116)
            ;
            ::wasm::LazyLocalGraph::canMoveSet
                      ((LocalSet *)local_80,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
            local_30.data_ = local_68;
            local_44 = 0;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&local_40,"graph.canMoveSet(set, nopA).size()","0U",
                       (unsigned_long *)&local_30,&local_44);
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_80);
            if (local_40.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)local_80);
              if (local_38 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_38->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0xa3,pcVar4);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_80._1_7_,local_80[0]) + 8))();
              }
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
            ::wasm::LazyLocalGraph::canMoveSet
                      ((LocalSet *)local_80,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
            local_30.data_ = local_68;
            local_44 = 1;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&local_40,"graph.canMoveSet(set, nopB).size()","1U",
                       (unsigned_long *)&local_30,&local_44);
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_80);
            if (local_40.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)local_80);
              if (local_38 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_38->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0xa4,pcVar4);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_80._1_7_,local_80[0]) + 8))();
              }
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
            ::wasm::LazyLocalGraph::canMoveSet
                      ((LocalSet *)local_80,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
            local_30.data_ = local_68;
            local_44 = 2;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&local_40,"graph.canMoveSet(set, nopC).size()","2U",
                       (unsigned_long *)&local_30,&local_44);
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_80);
            if (local_40.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)local_80);
              if (local_38 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_38->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0xa5,pcVar4);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_80._1_7_,local_80[0]) + 8))();
              }
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
            ::wasm::LazyLocalGraph::~LazyLocalGraph
                      ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket);
            goto LAB_001a84f0;
          }
        }
      }
      pcVar4 = "T *wasm::Expression::cast() [T = wasm::Nop]";
    }
    else {
      pcVar4 = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
    }
  }
  else {
    pcVar4 = "T *wasm::Expression::cast() [T = wasm::Block]";
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,pcVar4);
}

Assistant:

TEST_F(LocalGraphTest, ObstacleMultiGet) {
  auto moduleText = R"wasm(
    (module
      (func $foo
        ;; A set with multiple gets.
        (local $x i32)
        (local.set $x
          (i32.const 10)
        )
        (nop)
        (drop
          (local.get $x)
        )
        (nop)
        (drop
          (local.get $x)
        )
        (nop)
      )
    )
  )wasm";
  Module wasm;
  ASSERT_FALSE(WATParser::parseModule(wasm, moduleText).getErr());
  auto* func = wasm.functions[0].get();
  auto* block = func->body->cast<Block>();
  auto* set = block->list[0]->cast<LocalSet>();
  auto* nopA = block->list[1]->cast<Nop>();
  auto* nopB = block->list[3]->cast<Nop>();
  auto* nopC = block->list[5]->cast<Nop>();

  LazyLocalGraph graph(func, &wasm, Nop::SpecificId);
  // The first nop blocks them both, but not the second, and the third blocks
  // nothing.
  EXPECT_EQ(graph.canMoveSet(set, nopA).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(set, nopB).size(), 1U);
  EXPECT_EQ(graph.canMoveSet(set, nopC).size(), 2U);
}